

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pageReinit(DbPage *pData)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  u32 uVar5;
  uint uVar6;
  MemPage *pPage;
  BtShared *pBVar7;
  u8 *puVar8;
  uint uVar9;
  u16 uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ushort uVar15;
  uint uVar16;
  ushort uVar17;
  ulong uVar18;
  
  pPage = (MemPage *)pData->pExtra;
  if ((pPage->isInit == '\0') || (pPage->isInit = '\0', pData->nRef < 2)) {
    return;
  }
  pBVar7 = pPage->pBt;
  puVar8 = pPage->aData;
  bVar1 = pPage->hdrOffset;
  iVar11 = decodeFlags(pPage,(uint)puVar8[bVar1]);
  if (iVar11 == 0) {
    uVar5 = pBVar7->pageSize;
    pPage->maskPage = (short)uVar5 - 1;
    pPage->nOverflow = '\0';
    uVar6 = pBVar7->usableSize;
    bVar2 = pPage->childPtrSize;
    pPage->cellOffset = bVar1 + 8 + (ushort)bVar2;
    pPage->aDataEnd = puVar8 + (int)uVar6;
    pPage->aCellIdx = puVar8 + (ulong)((uint)bVar1 + (uint)bVar2) + 8;
    pPage->aDataOfst = puVar8 + bVar2;
    bVar3 = puVar8[(ulong)bVar1 + 5];
    bVar4 = puVar8[(ulong)bVar1 + 6];
    uVar15 = *(ushort *)(puVar8 + (ulong)bVar1 + 3) << 8 |
             *(ushort *)(puVar8 + (ulong)bVar1 + 3) >> 8;
    pPage->nCell = uVar15;
    if ((uVar5 - 8) / 6 < (uint)uVar15) {
      iVar11 = 0xefd1;
    }
    else {
      lVar14 = (ulong)((uint)bVar1 + (uint)bVar2) + 8;
      uVar12 = (int)lVar14 + (uint)uVar15 * 2;
      iVar11 = uVar6 - 4;
      if ((pBVar7->db->flags & 0x100000) == 0) {
LAB_00129065:
        uVar15 = *(ushort *)(puVar8 + (ulong)bVar1 + 1) << 8 |
                 *(ushort *)(puVar8 + (ulong)bVar1 + 1) >> 8;
        iVar13 = (uint)puVar8[(ulong)bVar1 + 7] +
                 (((uint)bVar3 * 0x100 + (uint)bVar4) - 1 & 0xffff) + 1;
        if (uVar15 != 0) {
          uVar9 = (uint)uVar15;
          if (uVar15 < uVar12) {
            iVar11 = 0xf004;
            goto LAB_00128fa9;
          }
          do {
            uVar16 = uVar9;
            if (iVar11 < (int)uVar16) {
              iVar11 = 0xf009;
              goto LAB_00128fa9;
            }
            uVar15 = *(ushort *)(puVar8 + uVar16) << 8 | *(ushort *)(puVar8 + uVar16) >> 8;
            uVar17 = *(ushort *)(puVar8 + (ulong)uVar16 + 2) << 8 |
                     *(ushort *)(puVar8 + (ulong)uVar16 + 2) >> 8;
            iVar13 = iVar13 + (uint)uVar17;
            uVar9 = (uint)uVar15;
          } while (uVar17 + uVar16 + 3 < (uint)uVar15);
          if (uVar15 != 0) {
            iVar11 = 0xf013;
            goto LAB_00128fa9;
          }
          if (uVar6 < uVar17 + uVar16) {
            iVar11 = 0xf017;
            goto LAB_00128fa9;
          }
        }
        if (iVar13 <= (int)uVar6) {
          pPage->nFree = (short)iVar13 - (short)uVar12;
          pPage->isInit = '\x01';
          return;
        }
        iVar11 = 0xf023;
      }
      else {
        if (pPage->leaf == '\0') {
          iVar11 = uVar6 - 5;
        }
        uVar18 = 0;
        do {
          if (pPage->nCell <= uVar18) {
            iVar11 = iVar11 + (uint)(pPage->leaf == '\0');
            goto LAB_00129065;
          }
          uVar15 = *(ushort *)(puVar8 + uVar18 * 2 + lVar14) << 8 |
                   *(ushort *)(puVar8 + uVar18 * 2 + lVar14) >> 8;
          if ((uVar15 < uVar12) || (iVar11 < (int)(uint)uVar15)) {
            iVar11 = 0xefed;
            goto LAB_00128fa9;
          }
          uVar10 = (*pPage->xCellSize)(pPage,puVar8 + uVar15);
          uVar18 = uVar18 + 1;
        } while ((int)((uint)uVar10 + (uint)uVar15) <= (int)uVar6);
        iVar11 = 0xeff2;
      }
    }
  }
  else {
    iVar11 = 0xefbe;
  }
LAB_00128fa9:
  sqlite3CorruptError(iVar11);
  return;
}

Assistant:

static void pageReinit(DbPage *pData){
  MemPage *pPage;
  pPage = (MemPage *)sqlite3PagerGetExtra(pData);
  assert( sqlite3PagerPageRefcount(pData)>0 );
  if( pPage->isInit ){
    assert( sqlite3_mutex_held(pPage->pBt->mutex) );
    pPage->isInit = 0;
    if( sqlite3PagerPageRefcount(pData)>1 ){
      /* pPage might not be a btree page;  it might be an overflow page
      ** or ptrmap page or a free page.  In those cases, the following
      ** call to btreeInitPage() will likely return SQLITE_CORRUPT.
      ** But no harm is done by this.  And it is very important that
      ** btreeInitPage() be called on every btree page so we make
      ** the call for every page that comes in for re-initing. */
      btreeInitPage(pPage);
    }
  }
}